

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::parseModuleStructs(Parser *this,ScannedTopLevelItem *item)

{
  ulong uVar1;
  Module *pMVar2;
  size_t sVar3;
  size_type sVar4;
  reference pvVar5;
  RefCountedPtr<soul::Structure> *this_00;
  Structure *s;
  UTF8Reader local_48;
  ArrayView<soul::RefCountedPtr<soul::Structure>_> local_40;
  UTF8Reader local_30;
  ulong local_28;
  size_t i;
  UTF8Reader nextItemPos;
  ScannedTopLevelItem *item_local;
  Parser *this_local;
  
  nextItemPos.data = (char *)item;
  prepareToRescan(this,item);
  pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
  sVar3 = Module::Structs::size(&pMVar2->structs);
  sVar4 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::size
                    ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)
                     (nextItemPos.data + 0x40));
  checkAssertion(sVar3 == sVar4,"module->structs.size() == item.structBodyCode.size()",
                 "parseModuleStructs",0xd6);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  getCurrentTokeniserPosition
            ((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              *)&i);
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    sVar4 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::size
                      ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)
                       (nextItemPos.data + 0x40));
    if (sVar4 <= uVar1) break;
    pvVar5 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::operator[]
                       ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)
                        (nextItemPos.data + 0x40),local_28);
    UTF8Reader::UTF8Reader(&local_30,pvVar5);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    resetPosition(&this->
                   super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ,&local_30);
    pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
    local_40 = Module::Structs::get(&pMVar2->structs);
    this_00 = ArrayView<soul::RefCountedPtr<soul::Structure>_>::operator[](&local_40,local_28);
    s = RefCountedPtr<soul::Structure>::operator*(this_00);
    parseStructBody(this,s);
    local_28 = local_28 + 1;
  }
  UTF8Reader::UTF8Reader(&local_48,(UTF8Reader *)&i);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  resetPosition(&this->
                 super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ,&local_48);
  pool_ptr<soul::Module>::reset(&this->module);
  return;
}

Assistant:

void parseModuleStructs (ScannedTopLevelItem& item)
    {
        prepareToRescan (item);
        SOUL_ASSERT (module->structs.size() == item.structBodyCode.size());

        auto nextItemPos = getCurrentTokeniserPosition();

        for (size_t i = 0; i < item.structBodyCode.size(); ++i)
        {
            resetPosition (item.structBodyCode[i]);
            parseStructBody (*module->structs.get()[i]);
        }

        resetPosition (nextItemPos);
        module.reset();
    }